

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O3

bool runtest<wchar_t>(char *inifile,char *expectedfile,
                     basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os)

{
  list<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *this;
  long *plVar1;
  int iVar2;
  wostream *pwVar3;
  undefined8 uVar4;
  _List_node_base *p_Var5;
  wostream *unaff_R12;
  bool bVar6;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> expected;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> actual;
  Ini<wchar_t> ini;
  basic_ifstream<wchar_t,_std::char_traits<wchar_t>_> is;
  allocator<char> local_479;
  wostream *local_478;
  size_t local_470;
  long local_468 [2];
  wchar_t *local_458;
  size_t local_450;
  long local_448 [2];
  long *local_438 [2];
  long local_428 [2];
  Ini<wchar_t> local_418;
  wostringstream local_3c0 [16];
  wostream local_3b0 [96];
  ios_base local_350 [16];
  ios_base local_340 [264];
  wifstream local_238 [16];
  wstreambuf local_228 [504];
  
  inipp::Ini<wchar_t>::Ini(&local_418);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_478,inifile,(allocator<char> *)local_438);
  std::__cxx11::wostringstream::wostringstream(local_3c0);
  std::wifstream::wifstream(local_238,(string *)&local_478,_S_in);
  inipp::Ini<wchar_t>::parse
            (&local_418,(basic_istream<wchar_t,_std::char_traits<wchar_t>_> *)local_238);
  std::wifstream::~wifstream(local_238);
  pwVar3 = std::operator<<((wostream *)local_3c0,">>> ERRORS <<<");
  plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) + 0xf0);
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x50))(plVar1,10);
    std::wostream::put((wchar_t)pwVar3);
    std::wostream::flush();
    this = &local_418.errors;
    if (local_418.errors.
        super__List_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)this) {
      unaff_R12 = (wostream *)local_3c0;
      p_Var5 = local_418.errors.
               super__List_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ._M_impl._M_node.super__List_node_base._M_next;
      do {
        pwVar3 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                           (unaff_R12,(wchar_t *)p_Var5[1]._M_next,(long)p_Var5[1]._M_prev);
        plVar1 = *(long **)(pwVar3 + *(long *)(*(long *)pwVar3 + -0x18) + 0xf0);
        if (plVar1 == (long *)0x0) goto LAB_0010511a;
        (**(code **)(*plVar1 + 0x50))(plVar1,10);
        std::wostream::put((wchar_t)pwVar3);
        std::wostream::flush();
        p_Var5 = p_Var5->_M_next;
      } while (p_Var5 != (_List_node_base *)this);
    }
    unaff_R12 = std::operator<<((wostream *)local_3c0,">>> GENERATE <<<");
    plVar1 = *(long **)(unaff_R12 + *(long *)(*(long *)unaff_R12 + -0x18) + 0xf0);
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 0x50))(plVar1,10);
      std::wostream::put((wchar_t)unaff_R12);
      std::wostream::flush();
      inipp::Ini<wchar_t>::generate
                (&local_418,(basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)local_3c0);
      unaff_R12 = std::operator<<((wostream *)local_3c0,">>> INTERPOLATE <<<");
      plVar1 = *(long **)(unaff_R12 + *(long *)(*(long *)unaff_R12 + -0x18) + 0xf0);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 0x50))(plVar1,10);
        std::wostream::put((wchar_t)unaff_R12);
        std::wostream::flush();
        inipp::Ini<wchar_t>::interpolate(&local_418);
        inipp::Ini<wchar_t>::generate
                  (&local_418,(basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)local_3c0);
        std::__cxx11::wstringbuf::str();
        std::__cxx11::wostringstream::~wostringstream(local_3c0);
        std::ios_base::~ios_base(local_350);
        if (local_478 != (wostream *)local_468) {
          operator_delete(local_478,local_468[0] + 1);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_438,expectedfile,&local_479);
        std::wifstream::wifstream(local_238,(string *)local_438,_S_in);
        std::__cxx11::wstringstream::wstringstream((wstringstream *)local_3c0);
        std::wostream::operator<<(local_3b0,local_228);
        std::__cxx11::wstringbuf::str();
        std::__cxx11::wstringstream::~wstringstream((wstringstream *)local_3c0);
        std::ios_base::~ios_base(local_340);
        std::wifstream::~wifstream(local_238);
        if (local_438[0] != local_428) {
          operator_delete(local_438[0],local_428[0] + 1);
        }
        std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>((wostream *)os,local_458,local_450)
        ;
        if (local_450 == local_470) {
          if (local_450 == 0) {
            bVar6 = true;
          }
          else {
            iVar2 = wmemcmp(local_458,(wchar_t *)local_478,local_450);
            bVar6 = iVar2 == 0;
          }
        }
        else {
          bVar6 = false;
        }
        if (local_478 != (wostream *)local_468) {
          operator_delete(local_478,local_468[0] * 4 + 4);
        }
        if (local_458 != (wchar_t *)local_448) {
          operator_delete(local_458,local_448[0] * 4 + 4);
        }
        if (local_418.format.super___shared_ptr<inipp::Format<wchar_t>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_418.format.
                     super___shared_ptr<inipp::Format<wchar_t>,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        std::__cxx11::
        _List_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::_M_clear(&this->
                    super__List_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                  );
        std::_Rb_tree<$1b915379$>::~_Rb_tree((_Rb_tree<_1b915379_> *)&local_418);
        return bVar6;
      }
    }
  }
LAB_0010511a:
  uVar4 = std::__throw_bad_cast();
  if (local_478 != unaff_R12) {
    operator_delete(local_478,local_468[0] * 4 + 4);
  }
  if (local_458 != (wchar_t *)local_448) {
    operator_delete(local_458,local_448[0] * 4 + 4);
  }
  inipp::Ini<wchar_t>::~Ini(&local_418);
  _Unwind_Resume(uVar4);
}

Assistant:

static inline bool runtest(const char *inifile, const char *expectedfile, std::basic_ostream<CharT> & os) {
	Ini<CharT> ini;
	auto actual = test(inifile, ini);
	auto expected = read_all<CharT>(expectedfile);
	os << actual;
	return (actual == expected);
}